

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

void Z80::OpCode_IN(void)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  Z80Reg ZVar4;
  undefined1 signedCheck;
  undefined8 in_RSI;
  char **in_RDI;
  undefined8 local_38;
  undefined4 local_30;
  
  do {
    signedCheck = (undefined1)in_RSI;
    local_30 = 0xffffffff;
    local_38 = 0xffffffffffffffff;
    ZVar4 = GetRegister(in_RDI);
    if (ZVar4 == Z80_UNK) {
      ZVar4 = Z80_F;
LAB_00136987:
      if ((Options::IsI8080 == '\0') && (bVar1 = NeedIoC(), bVar1)) {
        if ((uint)ZVar4 < 6) {
LAB_001369a4:
          local_38 = CONCAT44(ZVar4 * 8 + 0x40,0xed);
        }
        else if (ZVar4 == Z80_F) {
          local_38 = 0x70000000ed;
        }
        else {
          if (ZVar4 == Z80_A) goto LAB_001369a4;
          local_38 = CONCAT44(local_38._4_4_,0xffffffff);
        }
      }
      else {
        bVar2 = GetByte((char **)0x0,(bool)signedCheck);
        local_38 = (ulong)CONCAT14(bVar2,(int)local_38);
        if (ZVar4 == Z80_A) {
          local_38._4_4_ = (uint)bVar2;
          local_38 = CONCAT44(local_38._4_4_,0xdb);
        }
      }
    }
    else {
      bVar1 = comma(&lp);
      if (bVar1) goto LAB_00136987;
    }
    in_RSI = 1;
    EmitBytes((int *)&local_38,true);
    in_RDI = &lp;
    cVar3 = (*DAT_0018e520)();
    if (cVar3 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_IN() {
		do {
			int e[] { -1, -1, -1 };
			Z80Reg reg = GetRegister(lp);
			if (Z80_UNK == reg || comma(lp)) {
				if (Z80_UNK == reg) reg = Z80_F;	// if there was no register, it may be "IN (C)"
				if ((!Options::IsI8080) && NeedIoC()) {
					e[0] = 0xed;
					switch (reg) {
						case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L: case Z80_A:
							e[1] = 0x40 + reg*8;	// regular IN reg,(C)
							break;
						case Z80_F:
							e[1] = 0x70;			// unofficial IN F,(C)
							break;
						default:
							e[0] = -1;				// invalid combination
							break;
					}
				} else {
					e[1] = GetByte(lp);
					if (Z80_A == reg) e[0] = 0xdb;	// IN A,(n)
				}
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}